

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

EStatusCode __thiscall
ShadingWriter::WriteShadingPatternObjectWithPDFCustomFunctions
          (ShadingWriter *this,SweepShading *inSweepShading,PDFRectangle *inBounds,
          PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  double dVar1;
  PrimitiveObjectsWriter local_90;
  PrimitiveObjectsWriter primitiveWriter;
  IByteWriter *writeStream;
  undefined1 local_70 [8];
  PDFMatrix patternProgramMatrix;
  PDFStream *pdfStream;
  EStatusCode status;
  ObjectIDType inPatternObjectId_local;
  PDFMatrix *inMatrix_local;
  PDFRectangle *inBounds_local;
  SweepShading *inSweepShading_local;
  ShadingWriter *this_local;
  
  patternProgramMatrix.f = 0.0;
  PDFMatrix::PDFMatrix((PDFMatrix *)local_70,1.0,0.0,0.0,1.0,inSweepShading->cX,inSweepShading->cY);
  patternProgramMatrix.f =
       (double)StartCustomFunctionShadingPatternStream
                         (this,(PDFMatrix *)local_70,inBounds,inMatrix,inPatternObjectId);
  if ((PDFStream *)patternProgramMatrix.f == (PDFStream *)0x0) {
    pdfStream._4_4_ = eFailure;
  }
  else {
    primitiveWriter.mStreamForWriting =
         PDFStream::GetWriteStream((PDFStream *)patternProgramMatrix.f);
    PrimitiveObjectsWriter::PrimitiveObjectsWriter(&local_90,primitiveWriter.mStreamForWriting);
    WriteGradientCustomFunctionProgram
              (this,inSweepShading,primitiveWriter.mStreamForWriting,&local_90);
    pdfStream._4_4_ =
         ObjectsContext::EndPDFStream(this->mObjectsContext,(PDFStream *)patternProgramMatrix.f);
    PrimitiveObjectsWriter::~PrimitiveObjectsWriter(&local_90);
  }
  dVar1 = patternProgramMatrix.f;
  if (patternProgramMatrix.f != 0.0) {
    PDFStream::~PDFStream((PDFStream *)patternProgramMatrix.f);
    operator_delete((void *)dVar1,0xf0);
  }
  PDFMatrix::~PDFMatrix((PDFMatrix *)local_70);
  return pdfStream._4_4_;
}

Assistant:

EStatusCode ShadingWriter::WriteShadingPatternObjectWithPDFCustomFunctions(
    const SweepShading& inSweepShading, 
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId) {
    EStatusCode status = eSuccess;
    PDFStream* pdfStream = NULL;

    // apply transform matrix, to map pattern based on function range
    PDFMatrix patternProgramMatrix = PDFMatrix(1,0,0,1,inSweepShading.cX,inSweepShading.cY);

    do {
        pdfStream = StartCustomFunctionShadingPatternStream(patternProgramMatrix, inBounds, inMatrix, inPatternObjectId);
        if(!pdfStream) {
            status = eFailure;
            break;
        }

        IByteWriter* writeStream = pdfStream->GetWriteStream();
        PrimitiveObjectsWriter primitiveWriter(writeStream);
        WriteGradientCustomFunctionProgram(inSweepShading, writeStream, &primitiveWriter);
        status = mObjectsContext->EndPDFStream(pdfStream);
    } while(false);

    delete pdfStream;

    return status;
}